

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  int __x;
  VoxWriter *this;
  float extraout_XMM0_Da;
  double dVar1;
  allocator local_269;
  string local_268 [39];
  uint8_t local_241;
  size_t local_240;
  size_t local_238;
  size_t local_230;
  int local_228;
  int local_224;
  int32_t cube_color;
  int32_t pz;
  float len;
  int32_t j;
  int32_t i;
  int32_t k;
  float time;
  anon_class_1_0_00000001 local_1f9;
  KeyFrameTimeLoggingFunctor local_1f8;
  VoxelZ local_1d8;
  VoxelY local_1d0;
  VoxelX local_1c8;
  undefined1 local_1c0 [8];
  VoxWriter vox;
  float len_ratio;
  int32_t FRAMES;
  float Z_SCALE;
  int32_t OFFSET;
  int32_t SIZE;
  
  vox.m_KeyFrameTimeLoggingFunctor._M_invoker._4_4_ = 0x1e;
  vox.m_KeyFrameTimeLoggingFunctor._M_invoker._0_4_ = 0x37ead63d;
  local_1c8 = 0x7e;
  local_1d0 = 0x7e;
  local_1d8 = 0x7e;
  ::vox::VoxWriter::VoxWriter((VoxWriter *)local_1c0,&local_1c8,&local_1d0,&local_1d8);
  std::function<void(unsigned_int_const&,double_const&)>::function<main::__0,void>
            ((function<void(unsigned_int_const&,double_const&)> *)&local_1f8,&local_1f9);
  ::vox::VoxWriter::SetKeyFrameTimeLoggingFunctor((VoxWriter *)local_1c0,&local_1f8);
  std::function<void_(const_unsigned_int_&,_const_double_&)>::~function(&local_1f8);
  ::vox::VoxWriter::StartTimeLogging((VoxWriter *)local_1c0);
  i = 0;
  for (j = 0; j < 0x1e; j = j + 1) {
    this = (VoxWriter *)local_1c0;
    ::vox::VoxWriter::SetKeyFrame(this,j);
    for (len = -NAN; (int)len < 0xbd; len = (float)((int)len + 1)) {
      for (pz = -0xbd; __x = (int)this, pz < 0xbd; pz = pz + 1) {
        cube_color = (int32_t)((float)((int)len * (int)len + pz * pz) * 2.7994736e-05);
        dVar1 = sin((double)(float)cube_color * 10.0 + (double)(float)i);
        std::abs(__x);
        local_224 = (int)((dVar1 * 0.5 + 0.5) * (double)extraout_XMM0_Da);
        local_228 = (int)((float)cube_color * 100.0) + 1 +
                    ((int)((float)cube_color * 100.0) / 0xff) * -0xff;
        local_230 = (size_t)((int)len + 0xbd);
        local_238 = (size_t)(pz + 0xbd);
        local_240 = (size_t)local_224;
        local_241 = (uint8_t)local_228;
        this = (VoxWriter *)local_1c0;
        ::vox::VoxWriter::AddVoxel(this,&local_230,&local_238,&local_240,&local_241);
      }
    }
    i = (int32_t)((float)i + 0.5);
  }
  ::vox::VoxWriter::StopTimeLogging((VoxWriter *)local_1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_268,"output_voxwriter.vox",&local_269);
  ::vox::VoxWriter::SaveToFile((VoxWriter *)local_1c0,(string *)local_268);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  ::vox::VoxWriter::PrintStats((VoxWriter *)local_1c0);
  ::vox::VoxWriter::~VoxWriter((VoxWriter *)local_1c0);
  return 0;
}

Assistant:

int main() {
    const int32_t  SIZE      = 189;
    const int32_t  OFFSET    = SIZE;
    const float    Z_SCALE   = 1.0f;
    const int32_t  FRAMES    = 30;
    const float    len_ratio = 1.0f / (SIZE * SIZE);
    vox::VoxWriter vox;
    vox.SetKeyFrameTimeLoggingFunctor([](const vox::KeyFrame& vKeyFrame, const double& vValue) {  //
        std::cout << "Elapsed time for Frame " << vKeyFrame << " : " << vValue << " secs" << std::endl;
    });
    vox.StartTimeLogging();
    float time = 0.0f;
    for (int32_t k = 0; k < FRAMES; ++k) {
        vox.SetKeyFrame(k);
        for (int32_t i = -SIZE; i < SIZE; ++i) {
            for (int32_t j = -SIZE; j < SIZE; ++j) {
                float   len        = (i * i + j * j) * len_ratio;
                int32_t pz         = (int32_t)((std::sin(len * 10.0 + time) * 0.5 + 0.5) * (std::abs(50.0f - 25.0f * len)) * Z_SCALE);
                int32_t cube_color = (int32_t)(len * 100.0) % 255 + 1;
                vox.AddVoxel(i + OFFSET, j + OFFSET, pz, cube_color);  // magicavoxel use the z as up axis
            }
        }
        time += 0.5f;
    }
    vox.StopTimeLogging();
    vox.SaveToFile("output_voxwriter.vox");
    vox.PrintStats();
}